

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O3

string * mdns::parsePacket(string *__return_storage_ptr__,string *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  ostream *poVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  string hostname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  uVar7 = data->_M_string_length;
  if (uVar7 < 0x10) {
    if (s_verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Packet too small (",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes)",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  else {
    pcVar3 = (data->_M_dataplus)._M_p;
    bVar9 = true;
    if ((pcVar3[6] != '\0') || (bVar9 = pcVar3[7] != '\0', s_verbose || bVar9)) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      paVar1 = &local_70.field_2;
      uVar8 = 0xc;
      do {
        bVar2 = (data->_M_dataplus)._M_p[uVar8];
        uVar8 = uVar8 + 1;
        if (bVar2 == 0) break;
        uVar8 = (ulong)((int)uVar8 + (uint)bVar2 & 0xff);
        if (uVar7 <= uVar8) {
          if (s_verbose == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr," ! Invalid packet, next pos out of range (",0x2a);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," max: ",6);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
          goto LAB_001074b9;
        }
        std::__cxx11::string::substr((ulong)local_50,(ulong)data);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_70.field_2._M_allocated_capacity = *psVar6;
          local_70.field_2._8_8_ = plVar5[3];
          local_70._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar6;
          local_70._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_70._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        uVar7 = data->_M_string_length;
      } while (uVar8 + 2 < uVar7);
      if ((s_verbose == true) && (uVar8 + 4 != uVar7)) {
        printf("Failed to parse entire packet (%lu/%lu), hostname: %s\n",uVar8,uVar7,
               local_90._M_dataplus._M_p);
      }
      if (bVar9) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                        local_90.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_90.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_90._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                        local_90.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = local_90._M_string_length;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        if (s_verbose == true) {
          std::operator+(&local_70,
                         " - Packet with no query response (probably another request) for ",
                         &local_90);
          puts(local_70._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar1) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      }
LAB_001074b9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string parsePacket(const std::string &data)
{
    constexpr size_t minSize = queryHeader.size() + 4; // idk
    if (data.size() < minSize) {
        if (s_verbose) std::cerr << "Packet too small (" << data.size() << " bytes)" << std::endl;
        return "";
    }

    const bool hasResponse = !(data[6] == 0 && data[7] == 0);
    if (!s_verbose && !hasResponse) { // if verbose mode is on, parse the name anyways
        return "";
    }

    std::string hostname;
    size_t pos = queryHeader.size();
    while (pos + 2 < data.size()) {
        const uint8_t length = data[pos];
        pos++;

        // Ends with a '.'
        if (length == 0) {
            break;
        }

        const uint8_t nextPos = pos + length;
        if (nextPos >= data.size()) {
            if (s_verbose) std::cerr << " ! Invalid packet, next pos out of range (" << size_t(nextPos) << " max: " << data.size() << ")" << std::endl;
            return "";
        }
        hostname += data.substr(pos, length) + ".";

        pos = nextPos;
    }

    if (s_verbose && pos + queryFooter.size() != data.size()) {
        printf("Failed to parse entire packet (%lu/%lu), hostname: %s\n", pos, data.size(), hostname.c_str());
    }
    // No answers in packet
    if (!hasResponse) {
        if (s_verbose) puts((" - Packet with no query response (probably another request) for " + hostname).c_str());
        return "";
    }

    return hostname;
}